

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

QHostAddress __thiscall QNetmask::address(QNetmask *this,NetworkLayerProtocol protocol)

{
  int in_EDX;
  Q_IPV6ADDR *in_RSI;
  QExplicitlySharedDataPointer<QHostAddressPrivate> in_RDI;
  long in_FS_OFFSET;
  quint32 a;
  Q_IPV6ADDR a6;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar1;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RSI->c[0] == 0xff) || (in_EDX == 2)) || (in_EDX == -1)) {
    QHostAddress::QHostAddress((QHostAddress *)in_RDI.d.ptr);
  }
  else if (in_EDX == 0) {
    if (in_RSI->c[0] == '\0') {
      uVar1 = 0;
    }
    else if (in_RSI->c[0] == ' ') {
      uVar1 = 0xffffffff;
    }
    else {
      uVar1 = (0xffffffffU >> (0x20 - in_RSI->c[0] & 0x1f)) << (0x20 - in_RSI->c[0] & 0x1f);
    }
    QHostAddress::QHostAddress((QHostAddress *)(ulong)uVar1,(quint32)((ulong)in_RSI >> 0x20));
  }
  else {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    memset(&local_18,0xff,0x10);
    clearBits((quint8 *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),(int)((ulong)in_RSI >> 0x20),
              (int)in_RSI);
    QHostAddress::QHostAddress((QHostAddress *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QHostAddressPrivate>)
         (QExplicitlySharedDataPointer<QHostAddressPrivate>)in_RDI.d.ptr;
}

Assistant:

QHostAddress QNetmask::address(QHostAddress::NetworkLayerProtocol protocol) const
{
    if (length == 255 || protocol == QHostAddress::AnyIPProtocol ||
            protocol == QHostAddress::UnknownNetworkLayerProtocol) {
        return QHostAddress();
    } else if (protocol == QHostAddress::IPv4Protocol) {
        quint32 a;
        if (length == 0)
            a = 0;
        else if (length == 32)
            a = quint32(0xffffffff);
        else
            a = quint32(0xffffffff) >> (32 - length) << (32 - length);
        return QHostAddress(a);
    } else {
        Q_IPV6ADDR a6;
        memset(a6.c, 0xFF, sizeof(a6));
        clearBits(a6.c, length, 128);
        return QHostAddress(a6);
    }
}